

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointConnection::~IfcStructuralPointConnection
          (IfcStructuralPointConnection *this)

{
  ~IfcStructuralPointConnection
            ((IfcStructuralPointConnection *)&this[-1].super_IfcStructuralConnection.field_0x28);
  return;
}

Assistant:

IfcStructuralPointConnection() : Object("IfcStructuralPointConnection") {}